

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status cmsys::SystemTools::RemoveADirectory(string *source)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong dindex;
  Directory dir;
  string fullPath;
  Directory local_60;
  mode_t local_54;
  string local_50;
  
  local_54 = 0;
  SVar3 = GetPermissions(source,&local_54);
  if (SVar3.Kind_ == Success) {
    SetPermissions(source,local_54 | 0x80,false);
  }
  Directory::Directory(&local_60);
  SVar3 = Directory::Load(&local_60,source,(string *)0x0);
  uVar6 = (ulong)SVar3 >> 0x20;
  if (SVar3.Kind_ == Success) {
    dindex = 0;
    while( true ) {
      uVar4 = Directory::GetNumberOfFiles(&local_60);
      if (uVar4 <= dindex) break;
      pcVar5 = Directory::GetFile(&local_60,dindex);
      if ((*pcVar5 != '.') || (pcVar5[1] != '\0')) {
        pcVar5 = Directory::GetFile(&local_60,dindex);
        if ((*pcVar5 != '.') || ((pcVar5[1] != '.' || (pcVar5[2] != '\0')))) {
          std::__cxx11::string::string((string *)&local_50,(string *)source);
          std::__cxx11::string::append((char *)&local_50);
          Directory::GetFile(&local_60,dindex);
          std::__cxx11::string::append((char *)&local_50);
          bVar1 = FileIsDirectory(&local_50);
          if (bVar1) {
            bVar1 = FileIsSymlink(&local_50);
            if (bVar1) goto LAB_001272c3;
            SVar3 = RemoveADirectory(&local_50);
          }
          else {
LAB_001272c3:
            SVar3 = RemoveFile(&local_50);
          }
          uVar6 = (ulong)SVar3 >> 0x20;
          if (SVar3.Kind_ != Success) {
            std::__cxx11::string::~string((string *)&local_50);
            goto LAB_00127204;
          }
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      dindex = dindex + 1;
    }
    iVar2 = Rmdir(source);
    if (iVar2 == 0) {
      SVar3.Kind_ = Success;
      SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
    else {
      SVar3 = Status::POSIX_errno();
      uVar6 = (ulong)SVar3 >> 0x20;
    }
  }
LAB_00127204:
  Directory::~Directory(&local_60);
  return (Status)((ulong)SVar3 & 0xffffffff | uVar6 << 0x20);
}

Assistant:

Status SystemTools::RemoveADirectory(std::string const& source)
{
  // Add write permission to the directory so we can modify its
  // content to remove files and directories from it.
  mode_t mode = 0;
  if (SystemTools::GetPermissions(source, mode)) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IWRITE;
#else
    mode |= S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
  }

  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }

  size_t fileNum;
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath) &&
          !SystemTools::FileIsSymlink(fullPath)) {
        status = SystemTools::RemoveADirectory(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::RemoveFile(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  if (Rmdir(source) != 0) {
    status = Status::POSIX_errno();
  }
  return status;
}